

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O3

void __thiscall
QStandardItemModelPrivate::columnsRemoved
          (QStandardItemModelPrivate *this,QStandardItem *parent,int column,int count)

{
  QList<QStandardItem_*> *this_00;
  QStandardItem *pQVar1;
  Data *pDVar2;
  long lVar3;
  
  if ((this->root).d == parent) {
    if (0 < count) {
      lVar3 = (long)column;
      do {
        pQVar1 = (this->columnHeaderItems).d.ptr[lVar3];
        if (pQVar1 != (QStandardItem *)0x0) {
          QStandardItemPrivate::setModel((pQVar1->d_ptr).d,(QStandardItemModel *)0x0);
          (*pQVar1->_vptr_QStandardItem[1])(pQVar1);
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < count + column);
    }
    if (count != 0) {
      this_00 = &this->columnHeaderItems;
      pDVar2 = (this_00->d).d;
      if ((pDVar2 == (Data *)0x0) ||
         (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QArrayDataPointer<QStandardItem_*>::reallocateAndGrow
                  (&this_00->d,GrowsAtEnd,0,(QArrayDataPointer<QStandardItem_*> *)0x0);
      }
      QtPrivate::QPodArrayOps<QStandardItem_*>::erase
                ((QPodArrayOps<QStandardItem_*> *)this_00,(this->columnHeaderItems).d.ptr + column,
                 (long)count);
    }
  }
  QAbstractItemModel::endRemoveColumns();
  return;
}

Assistant:

void QStandardItemModelPrivate::columnsRemoved(QStandardItem *parent,
                                               int column, int count)
{
    Q_Q(QStandardItemModel);
    if (parent == root.data()) {
        for (int i = column; i < column + count; ++i) {
            QStandardItem *oldItem = columnHeaderItems.at(i);
            if (oldItem)
                oldItem->d_func()->setModel(nullptr);
            delete oldItem;
        }
        columnHeaderItems.remove(column, count);
    }
    q->endRemoveColumns();
}